

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void arena_bind(tsd_t *tsd,uint ind,_Bool internal)

{
  atomic_u_t *paVar1;
  uint uVar2;
  uint32_t *puVar3;
  long lVar4;
  arena_t *arena;
  
  arena = (arena_t *)duckdb_je_arenas[ind].repr;
  if (arena == (arena_t *)0x0) {
    arena = (arena_t *)0x0;
  }
  duckdb_je_arena_nthreads_inc(arena,internal);
  if (internal) {
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena = arena;
  }
  else {
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena = arena;
    LOCK();
    paVar1 = &arena->binshard_next;
    uVar2 = paVar1->repr;
    paVar1->repr = paVar1->repr + 1;
    UNLOCK();
    puVar3 = &duckdb_je_bin_infos[0].n_shards;
    lVar4 = 0;
    do {
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[lVar4] =
           (uint8_t)((uVar2 & 0xff) % *puVar3);
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + 10;
    } while (lVar4 != 0x24);
  }
  return;
}

Assistant:

static void
arena_bind(tsd_t *tsd, unsigned ind, bool internal) {
	arena_t *arena = arena_get(tsd_tsdn(tsd), ind, false);
	arena_nthreads_inc(arena, internal);

	if (internal) {
		tsd_iarena_set(tsd, arena);
	} else {
		tsd_arena_set(tsd, arena);
		/*
		 * While shard acts as a random seed, the cast below should
		 * not make much difference.
		 */
		uint8_t shard = (uint8_t)atomic_fetch_add_u(
		    &arena->binshard_next, 1, ATOMIC_RELAXED);
		tsd_binshards_t *bins = tsd_binshardsp_get(tsd);
		for (unsigned i = 0; i < SC_NBINS; i++) {
			assert(bin_infos[i].n_shards > 0 &&
			    bin_infos[i].n_shards <= BIN_SHARDS_MAX);
			bins->binshard[i] = shard % bin_infos[i].n_shards;
		}
	}
}